

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O0

bool iDynTree::vectorToString<iDynTree::VectorFixSize<3u>>(VectorFixSize<3U> *in,string *out_str)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  string *in_RSI;
  VectorFixSize<3U> *in_RDI;
  string bufStr;
  uint i;
  bool ok;
  stringstream ss;
  bool local_201;
  string local_1f8 [24];
  string *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  string local_1c0 [32];
  uint local_1a0;
  bool local_199;
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  VectorFixSize<3U> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_199 = true;
  local_1a0 = 0;
  while( true ) {
    uVar2 = (ulong)local_1a0;
    sVar3 = VectorFixSize<3U>::size(local_8);
    if (sVar3 <= uVar2) break;
    std::__cxx11::string::string(local_1c0);
    local_201 = false;
    if ((local_199 & 1U) != 0) {
      VectorFixSize<3U>::operator()(local_8,(ulong)local_1a0);
      local_201 = doubleToStringWithClassicLocale
                            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    }
    local_199 = local_201;
    if (local_1a0 != 0) {
      std::operator<<(local_188," ");
    }
    std::operator<<(local_188,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_10,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  bVar1 = local_199;
  std::__cxx11::stringstream::~stringstream(local_198);
  return (bool)(bVar1 & 1);
}

Assistant:

bool inline vectorToString(const iDynTreeVectorType & in, std::string & out_str)
{
    std::stringstream ss;
    bool ok = true;
    for (unsigned int i = 0; i < in.size(); ++i)
    {
        std::string bufStr;
        ok = ok && doubleToStringWithClassicLocale(in(i), bufStr);
        if (i != 0)
        {
            ss << " ";
        }
        ss << bufStr;
    }

    out_str = ss.str();

    return ok;
}